

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

WeightParamType CoreML::valueType(WeightParams *param)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  uint uVar5;
  WeightParamType WVar6;
  uint uVar7;
  
  iVar1 = (param->floatvalue_).current_size_;
  sVar2 = ((param->float16value_).ptr_)->_M_string_length;
  uVar7 = (0 < iVar1) + 1;
  if (sVar2 == 0) {
    uVar7 = (uint)(0 < iVar1);
  }
  sVar3 = ((param->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((param->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar7 = (uVar7 - (sVar3 == 0)) + 2;
  WVar6 = UNSPECIFIED;
  if (uVar7 - uVar5 < 2) {
    WVar6 = EMPTY;
    if (uVar7 != uVar5) {
      WVar6 = (uint)(iVar1 < 1);
    }
    if (((((sVar2 == 0) && (iVar1 < 1)) && (uVar7 != uVar5)) &&
        (((sVar3 == 0 || (param == (WeightParams *)&Specification::_WeightParams_default_instance_))
         || (WVar6 = QUINT, param->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar4 == 0 || (param == (WeightParams *)&Specification::_WeightParams_default_instance_))
        || (WVar6 = QINT, param->quantization_ == (QuantizationParams *)0x0)))) {
      return EMPTY;
    }
  }
  return WVar6;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}